

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<1,_2,_5,_0,_1>::evaluate
               (ShaderEvalContext *evalCtx)

{
  Vector<float,_3> local_5c;
  undefined1 local_50 [16];
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  VecAccess<float,_4,_3> local_30;
  
  getInputValue<2,5>((ShaderEvalContext *)local_50,(int)evalCtx);
  tcu::operator-((tcu *)&local_40,(Matrix<float,_2,_2> *)local_50,-0.2);
  local_5c.m_data[2] = local_3c + local_34;
  local_5c.m_data[0] = local_40;
  local_5c.m_data[1] = local_38;
  local_30.m_vector = &evalCtx->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,&local_5c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) - getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}